

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_random_round_trip.cpp
# Opt level: O3

void __thiscall
rtrip_testConversions_Test::~rtrip_testConversions_Test(rtrip_testConversions_Test *this)

{
  testing::Test::~Test
            ((Test *)&this[-1].super_rtrip.super_TestWithParam<unsigned_int>.super_Test.
                      gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(rtrip, testConversions)
{
    if (sizeof(UNITS_BASE_TYPE) == 4) {
        unsigned int start = GetParam();
        detail::unit_data unitdata(nullptr);
        memcpy(static_cast<void*>(&unitdata), &start, 4);
        auto startunit = unit(unitdata);
        auto str = to_string(startunit);
        auto resunit = unit_cast(unit_from_string(str));
        EXPECT_EQ(startunit, resunit) << "round trip failed " << start;
    }
}